

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

uint __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntryCount(cmELFInternalImpl<cmELFTypes32> *this)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar3 = LoadDynamicSection(this);
  uVar4 = 0;
  if (bVar3) {
    paVar1 = (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar2 = (this->DynamicSectionEntries).super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar5 = (long)paVar2 - (long)paVar1 >> 3;
    bVar3 = paVar2 != paVar1;
    uVar6 = 0;
    if ((bVar3) && (uVar6 = 0, paVar1->d_tag != 0)) {
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        uVar7 = (ulong)uVar6;
        bVar3 = uVar7 < uVar5;
        if (uVar5 <= uVar7) break;
        uVar4 = uVar6 + 1;
      } while (paVar1[uVar7].d_tag != 0);
    }
    uVar4 = (uint)uVar5;
    if (bVar3) {
      uVar4 = uVar6;
    }
  }
  return uVar4;
}

Assistant:

unsigned int cmELFInternalImpl<Types>::GetDynamicEntryCount()
{
  if(!this->LoadDynamicSection())
    {
    return 0;
    }
  for(unsigned int i = 0; i < this->DynamicSectionEntries.size(); ++i)
    {
    if(this->DynamicSectionEntries[i].d_tag == DT_NULL)
      {
      return i;
      }
    }
  return static_cast<unsigned int>(this->DynamicSectionEntries.size());
}